

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::clearTimeBarrier(CoreBroker *this)

{
  ActionMessage tbarrier;
  
  ActionMessage::ActionMessage(&tbarrier,cmd_time_barrier_request);
  tbarrier.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  tbarrier.actionTime.internalTimeCode = 0x7fffffffffffffff;
  tbarrier.flags._1_1_ = tbarrier.flags._1_1_ | 0x20;
  BrokerBase::addActionMessage(&this->super_BrokerBase,&tbarrier);
  ActionMessage::~ActionMessage(&tbarrier);
  return;
}

Assistant:

void CoreBroker::clearTimeBarrier()
{
    ActionMessage tbarrier(CMD_TIME_BARRIER_REQUEST);
    tbarrier.source_id = global_id.load();
    tbarrier.actionTime = Time::maxVal();
    setActionFlag(tbarrier, cancel_flag);
    addActionMessage(tbarrier);
}